

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O0

void printIssues(LoggerPtr *l,bool headings,bool cellmlElementTypes,bool rule)

{
  ulong uVar1;
  int iVar2;
  undefined8 uVar3;
  ulong uVar4;
  ostream *poVar5;
  double dVar6;
  undefined1 auVar7 [16];
  shared_ptr<libcellml::Issue> local_d8;
  string local_c8 [32];
  shared_ptr<libcellml::Issue> local_a8;
  shared_ptr<libcellml::Issue> local_98;
  shared_ptr<libcellml::AnyCellmlElement> local_88;
  shared_ptr<libcellml::Issue> local_78;
  string local_68 [32];
  int local_48;
  int local_44;
  int local_40;
  shared_ptr<libcellml::Issue> local_30;
  ulong local_20;
  size_t i;
  int width;
  bool rule_local;
  bool cellmlElementTypes_local;
  bool headings_local;
  LoggerPtr *l_local;
  
  i._5_1_ = rule;
  i._6_1_ = cellmlElementTypes;
  i._7_1_ = headings;
  _width = (__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)l;
  std::__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)l);
  uVar3 = libcellml::Logger::errorCount();
  auVar7._8_4_ = (int)((ulong)uVar3 >> 0x20);
  auVar7._0_8_ = uVar3;
  auVar7._12_4_ = 0x45300000;
  dVar6 = log10((auVar7._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
  dVar6 = floor(dVar6);
  i._0_4_ = (int)dVar6;
  local_20 = 0;
  while( true ) {
    uVar1 = local_20;
    std::__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->(_width);
    uVar4 = libcellml::Logger::issueCount();
    if (uVar4 <= uVar1) break;
    std::__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->(_width);
    libcellml::Logger::issue((ulong)&local_30);
    std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &local_30);
    iVar2 = libcellml::Issue::level();
    std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_30);
    if (iVar2 == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Error ");
      local_40 = (int)std::setw((int)i);
      poVar5 = std::operator<<(poVar5,(_Setw)local_40);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_20 + 1);
      std::operator<<(poVar5,": ");
    }
    else if (iVar2 == 1) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Warning ");
      local_44 = (int)std::setw((int)i);
      poVar5 = std::operator<<(poVar5,(_Setw)local_44);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_20 + 1);
      std::operator<<(poVar5,": ");
    }
    else if (iVar2 == 2) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Message ");
      local_48 = (int)std::setw((int)i);
      poVar5 = std::operator<<(poVar5,(_Setw)local_48);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_20 + 1);
      std::operator<<(poVar5,": ");
    }
    if ((i._7_1_ & 1) != 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,", ");
      std::__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->(_width);
      libcellml::Logger::issue((ulong)&local_78);
      std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &local_78);
      libcellml::Issue::referenceHeading_abi_cxx11_();
      std::operator<<(poVar5,local_68);
      std::__cxx11::string::~string(local_68);
      std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_78);
    }
    if ((i._6_1_ & 1) != 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,", ");
      std::__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->(_width);
      libcellml::Logger::issue((ulong)&local_98);
      std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &local_98);
      libcellml::Issue::item();
      std::
      __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&local_88);
      iVar2 = libcellml::AnyCellmlElement::type();
      std::ostream::operator<<(poVar5,iVar2);
      std::shared_ptr<libcellml::AnyCellmlElement>::~shared_ptr(&local_88);
      std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_98);
    }
    if ((i._5_1_ & 1) != 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,", ");
      std::__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->(_width);
      libcellml::Logger::issue((ulong)&local_a8);
      std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &local_a8);
      iVar2 = libcellml::Issue::referenceRule();
      std::ostream::operator<<(poVar5,iVar2);
      std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_a8);
    }
    poVar5 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::__shared_ptr_access<libcellml::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->(_width);
    libcellml::Logger::issue((ulong)&local_d8);
    std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &local_d8);
    libcellml::Issue::description_abi_cxx11_();
    poVar5 = std::operator<<(poVar5,local_c8);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_c8);
    std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_d8);
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void printIssues(const libcellml::LoggerPtr &l, bool headings, bool cellmlElementTypes, bool rule)
{
    int width = int(floor(log10(l->errorCount())));
    for (size_t i = 0; i < l->issueCount(); ++i) {
        switch (l->issue(i)->level()) {
        case libcellml::Issue::Level::ERROR:
            std::cout << "Error " << std::setw(width) << i + 1 << ": ";
            break;
        case libcellml::Issue::Level::WARNING:
            std::cout << "Warning " << std::setw(width) << i + 1 << ": ";
            break;
        case libcellml::Issue::Level::MESSAGE:
            std::cout << "Message " << std::setw(width) << i + 1 << ": ";
            break;
        default:
            break;
        }

        if (headings) {
            std::cout << ", " << l->issue(i)->referenceHeading();
        }
        if (cellmlElementTypes) {
            std::cout << ", " << static_cast<int>(l->issue(i)->item()->type());
        }
        if (rule) {
            std::cout << ", " << static_cast<int>(l->issue(i)->referenceRule());
        }
        std::cout << std::endl
                  << l->issue(i)->description() << std::endl;
    }
}